

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O3

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  long *infile;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  cmSourceFile *pcVar7;
  ulong *puVar8;
  undefined1 uVar9;
  string *psVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  pointer pbVar13;
  string *sourceName;
  pointer pbVar14;
  string sourceListValue;
  string driver;
  string functionMapCode;
  string forwardDeclareCode;
  string extraInclude;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string function;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string configFile;
  string local_1f0;
  cmCommand *local_1d0;
  string local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  string local_180;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  string local_138;
  string local_118;
  string local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = &this->super_cmCommand;
  local_188 = args;
  if ((ulong)((long)pbVar14 - (long)pbVar13) < 0x41) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"called with wrong number of arguments.","");
    cmCommand::SetError(local_1d0,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    uVar9 = 0;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88 = '\0';
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    if (pbVar13 != pbVar14) {
      do {
        iVar4 = std::__cxx11::string::compare((char *)pbVar13);
        if (iVar4 == 0) {
          pbVar14 = pbVar13 + 1;
          if (pbVar14 ==
              (local_188->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,"incorrect arguments to EXTRA_INCLUDE","");
            cmCommand::SetError(local_1d0,&local_1a8);
LAB_002ed4e5:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_002ec862;
            goto LAB_002ec855;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_f8,0,(char *)local_f8._M_string_length,0x4afecd);
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)pbVar13[1]._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_f8);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)pbVar13);
          if (iVar4 == 0) {
            pbVar14 = pbVar13 + 1;
            if (pbVar14 ==
                (local_188->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,"incorrect arguments to FUNCTION","");
              cmCommand::SetError(local_1d0,&local_1a8);
              goto LAB_002ed4e5;
            }
            std::__cxx11::string::_M_assign((string *)&local_98);
            std::__cxx11::string::append((char *)&local_98);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_d8,pbVar13);
            pbVar14 = pbVar13;
          }
        }
        pbVar13 = pbVar14 + 1;
      } while (pbVar13 !=
               (local_188->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar13 = local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = ((local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&local_1a8,
               local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    paVar1 = &local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8._M_string_length < 2) {
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"You must specify a file extension for the test driver file.",
                 "");
      cmCommand::SetError(local_1d0,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
LAB_002ec855:
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
LAB_002ec862:
      uVar9 = 0;
    }
    else {
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory(local_1d0->Makefile);
      std::__cxx11::string::string((string *)&local_1a8,pcVar5,(allocator *)local_50);
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)pbVar13[1]._M_dataplus._M_p);
      pcVar2 = local_1d0->Makefile;
      paVar1 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CMAKE_ROOT","");
      pcVar5 = cmMakefile::GetRequiredDefinition(pcVar2,&local_118);
      std::__cxx11::string::string((string *)local_50,pcVar5,(allocator *)&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)local_50);
      sourceName = pbVar13 + 2;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      if (sourceName ==
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        local_180._M_string_length = 0;
        local_180.field_2._M_local_buf[0] = '\0';
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p;
        local_118._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_140 = &local_180.field_2;
        psVar10 = sourceName;
        local_118._M_dataplus._M_p = (pointer)paVar1;
        do {
          iVar4 = std::__cxx11::string::compare((char *)psVar10);
          if (iVar4 == 0) {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            local_180._M_string_length = 0;
            local_180.field_2._M_local_buf[0] = '\0';
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_180._M_dataplus._M_p;
            if (sourceName ==
                local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ed06e;
            break;
          }
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          local_180._M_string_length = 0;
          local_180.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetFilenamePath(&local_1f0,psVar10);
          sVar3 = local_1f0._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (sVar3 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1f0,psVar10);
            std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
            uVar11 = local_1f0.field_2._M_allocated_capacity;
            _Var12._M_p = local_1f0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_002ecbf3;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_160,psVar10);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar8 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_1c8.field_2._M_allocated_capacity = *puVar8;
              local_1c8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar8;
              local_1c8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1c8._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,psVar10);
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              uVar11 = local_1c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_138._M_string_length + local_1c8._M_string_length) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                uVar11 = local_138.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_138._M_string_length + local_1c8._M_string_length)
              goto LAB_002ecb0f;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_138,0,(char *)0x0,(ulong)local_1c8._M_dataplus._M_p)
              ;
            }
            else {
LAB_002ecb0f:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1c8,(ulong)local_138._M_dataplus._M_p);
            }
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            puVar8 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_1f0.field_2._M_allocated_capacity = *puVar8;
              local_1f0.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *puVar8;
              local_1f0._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1f0._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)puVar8 = 0;
            std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar11 = local_160.field_2._M_allocated_capacity;
            _Var12._M_p = local_160._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
LAB_002ecbf3:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_180);
          cmsys::SystemTools::ReplaceString(&local_180," ","_");
          cmsys::SystemTools::ReplaceString(&local_180,"/","_");
          cmsys::SystemTools::ReplaceString(&local_180,":","_");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,&local_180);
          std::__cxx11::string::append((char *)&local_118);
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_180._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,
                            CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                     local_180.field_2._M_local_buf[0]) + 1);
          }
          psVar10 = psVar10 + 1;
        } while (psVar10 !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        local_180.field_2._M_local_buf[0] = '\0';
        local_180._M_string_length = 0;
        psVar10 = sourceName;
        pbVar13 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_allocated_capacity =
               local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          cmsys::SystemTools::GetFilenamePath(&local_1c8,psVar10);
          sVar3 = local_1c8._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (sVar3 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1c8,psVar10);
            std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1c8);
            uVar11 = local_1c8.field_2._M_allocated_capacity;
            _Var12._M_p = local_1c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_002ecfe9;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_138,psVar10);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            puVar8 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_160.field_2._M_allocated_capacity = *puVar8;
              local_160.field_2._8_8_ = puVar6[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *puVar8;
              local_160._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_160._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b8,psVar10);
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              uVar11 = local_160.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_b8._M_string_length + local_160._M_string_length) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                uVar11 = local_b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_b8._M_string_length + local_160._M_string_length)
              goto LAB_002eceef;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
            }
            else {
LAB_002eceef:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_160,(ulong)local_b8._M_dataplus._M_p);
            }
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar8 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_1c8.field_2._M_allocated_capacity = *puVar8;
              local_1c8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar8;
              local_1c8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1c8._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)puVar8 = 0;
            std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            uVar11 = local_138.field_2._M_allocated_capacity;
            _Var12._M_p = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_002ecfe9:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_180);
          std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1f0._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_180);
          std::__cxx11::string::_M_append((char *)&local_180,(ulong)(pbVar13->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          psVar10 = psVar10 + 1;
          pbVar13 = pbVar13 + 1;
        } while (psVar10 !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_002ed06e:
      if ((char *)local_f8._M_string_length != (char *)0x0) {
        pcVar2 = local_1d0->Makefile;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        cmMakefile::AddDefinition(pcVar2,&local_1f0,local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_90 != 0) {
        pcVar2 = local_1d0->Makefile;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        cmMakefile::AddDefinition(pcVar2,&local_1f0,local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar2 = local_1d0->Makefile;
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"CMAKE_FORWARD_DECLARE_TESTS","");
      cmMakefile::AddDefinition(pcVar2,&local_1f0,local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = local_1d0->Makefile;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"CMAKE_FUNCTION_TABLE_ENTIRES","");
      cmMakefile::AddDefinition(pcVar2,&local_1f0,local_180._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      infile = local_50[0];
      _Var12._M_p = local_1a8._M_dataplus._M_p;
      pcVar2 = local_1d0->Makefile;
      cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&local_1f0);
      iVar4 = cmMakefile::ConfigureFile
                        (pcVar2,(char *)infile,_Var12._M_p,false,true,false,
                         (cmNewLineStyle *)&local_1f0);
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity =
           local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      pcVar7 = cmMakefile::GetOrCreateSource(local_1d0->Makefile,&local_1a8,false);
      paVar1 = &local_1c8.field_2;
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar7,&local_1c8,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_1f0);
      local_188 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(local_188._4_4_,(int)CONCAT71((int7)((ulong)infile >> 8),iVar4 != 0));
      if (sourceName !=
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar7 = cmMakefile::GetOrCreateSource(local_1d0->Makefile,sourceName,false);
          local_1c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar7,&local_1c8,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1f0);
          std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(sourceName->_M_dataplus)._M_p);
          sourceName = sourceName + 1;
        } while (sourceName !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar2 = local_1d0->Makefile;
      std::__cxx11::string::string((string *)&local_1c8,local_58,(allocator *)&local_160);
      cmMakefile::AddDefinition(pcVar2,&local_1c8,local_1f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = local_188._0_1_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != local_140) {
        operator_delete(local_180._M_dataplus._M_p,
                        CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                 local_180.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)uVar9;
}

Assistant:

bool cmCreateTestSourceList
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size() < 3)
    {
    this->SetError("called with wrong number of arguments.");
    return false;
    }


  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for(; i != args.end(); i++)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
        }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
      }
    else if(*i == "FUNCTION")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
        }
      function = *i;
      function += "(&ac, &av);\n";
      }
    else
      {
      tests.push_back(*i);
      }
    }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2)
    {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
    }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile =
    this->Makefile->GetRequiredDefinition("CMAKE_ROOT");

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for(i = testsBegin; i != tests.end(); ++i)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      break;
      }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    cmSystemTools::ReplaceString(func_name, " ", "_");
    cmSystemTools::ReplaceString(func_name, "/", "_");
    cmSystemTools::ReplaceString(func_name, ":", "_");
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
    }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for(i = testsBegin, j = tests_func_name.begin(); i != tests.end(); ++i, ++j)
    {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    functionMapCode += "  {\n"
      "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
      "    ";
    functionMapCode +=  *j;
    functionMapCode += "\n"
      "  },\n";
    numTests++;
    }
  if(!extraInclude.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
    }
  if(!function.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
    }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
    forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
    functionMapCode.c_str());
  bool res = true;
  if ( !this->Makefile->ConfigureFile(configFile.c_str(), driver.c_str(),
      false, true, false) )
    {
    res = false;
    }

  // Construct the source list.
  std::string sourceListValue;
  {
  cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
  sf->SetProperty("ABSTRACT","0");
  sourceListValue = args[1];
  }
  for(i = testsBegin; i != tests.end(); ++i)
    {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT","0");
    sourceListValue += ";";
    sourceListValue += *i;
    }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}